

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

Io_ReadBlif_t * Io_ReadBlifFile(char *pFileName)

{
  Extra_FileReader_t *pEVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Str_t *pVVar3;
  Vec_Int_t *pVVar4;
  Io_ReadBlif_t *p;
  Extra_FileReader_t *pReader;
  char *pFileName_local;
  
  pEVar1 = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t");
  if (pEVar1 == (Extra_FileReader_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)malloc(0x488);
    memset(pFileName_local,0,0x488);
    *(char **)pFileName_local = pFileName;
    *(Extra_FileReader_t **)(pFileName_local + 8) = pEVar1;
    *(undefined8 *)(pFileName_local + 0x90) = _stdout;
    pVVar2 = Vec_PtrAlloc(100);
    *(Vec_Ptr_t **)(pFileName_local + 0x30) = pVVar2;
    pVVar3 = Vec_StrAlloc(100);
    *(Vec_Str_t **)(pFileName_local + 0x38) = pVVar3;
    pVVar4 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(pFileName_local + 0x40) = pVVar4;
    pVVar4 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(pFileName_local + 0x48) = pVVar4;
    pVVar4 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(pFileName_local + 0x50) = pVVar4;
    pVVar4 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(pFileName_local + 0x58) = pVVar4;
  }
  return (Io_ReadBlif_t *)pFileName_local;
}

Assistant:

Io_ReadBlif_t * Io_ReadBlifFile( char * pFileName )
{
    Extra_FileReader_t * pReader;
    Io_ReadBlif_t * p;

    // start the reader
    pReader = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t" );

    if ( pReader == NULL )
        return NULL;

    // start the reading data structure
    p = ABC_ALLOC( Io_ReadBlif_t, 1 );
    memset( p, 0, sizeof(Io_ReadBlif_t) );
    p->pFileName  = pFileName;
    p->pReader    = pReader;
    p->Output     = stdout;
    p->vNewTokens = Vec_PtrAlloc( 100 );
    p->vCubes     = Vec_StrAlloc( 100 );
    p->vInArrs    = Vec_IntAlloc( 100 );
    p->vOutReqs   = Vec_IntAlloc( 100 );
    p->vInDrives  = Vec_IntAlloc( 100 );
    p->vOutLoads  = Vec_IntAlloc( 100 );
    return p;
}